

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltm.c
# Opt level: O1

void luaT_callTM(lua_State *L,TValue *f,TValue *p1,TValue *p2,TValue *p3)

{
  byte *pbVar1;
  uint uVar2;
  CallInfo *ci;
  StkId func;
  StkId pSStack_20;
  
  func = (L->top).p;
  (func->val).value_ = f->value_;
  (func->val).tt_ = f->tt_;
  func[1].val.value_ = p1->value_;
  *(lu_byte *)((long)func + 0x18) = p1->tt_;
  func[2].val.value_ = p2->value_;
  *(lu_byte *)((long)func + 0x28) = p2->tt_;
  func[3].val.value_ = p3->value_;
  *(lu_byte *)((long)func + 0x38) = p3->tt_;
  (L->top).p = func + 4;
  if ((L->ci->callstatus & 0x108000) == 0) {
    luaD_call(L,func,0);
    return;
  }
  uVar2 = L->nCcalls + 0x10001;
  L->nCcalls = uVar2;
  if (199 < (uVar2 & 0xfff8)) {
    luaD_callnoyield_cold_1();
    func = pSStack_20;
  }
  ci = luaD_precall(L,func,0);
  if (ci != (CallInfo *)0x0) {
    pbVar1 = (byte *)((long)&ci->callstatus + 2);
    *pbVar1 = *pbVar1 | 1;
    luaV_execute(L,ci);
  }
  L->nCcalls = L->nCcalls - 0x10001;
  return;
}

Assistant:

void luaT_callTM (lua_State *L, const TValue *f, const TValue *p1,
                  const TValue *p2, const TValue *p3) {
  StkId func = L->top.p;
  setobj2s(L, func, f);  /* push function (assume EXTRA_STACK) */
  setobj2s(L, func + 1, p1);  /* 1st argument */
  setobj2s(L, func + 2, p2);  /* 2nd argument */
  setobj2s(L, func + 3, p3);  /* 3rd argument */
  L->top.p = func + 4;
  /* metamethod may yield only when called from Lua code */
  if (isLuacode(L->ci))
    luaD_call(L, func, 0);
  else
    luaD_callnoyield(L, func, 0);
}